

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_cleanup(archive_read *a)

{
  void *__ptr;
  long in_RDI;
  ar *ar;
  
  __ptr = (void *)**(undefined8 **)(in_RDI + 0x948);
  if (*(long *)((long)__ptr + 0x20) != 0) {
    free(*(void **)((long)__ptr + 0x20));
  }
  free(__ptr);
  **(undefined8 **)(in_RDI + 0x948) = 0;
  return 0;
}

Assistant:

static int
archive_read_format_ar_cleanup(struct archive_read *a)
{
	struct ar *ar;

	ar = (struct ar *)(a->format->data);
	if (ar->strtab)
		free(ar->strtab);
	free(ar);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}